

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdGetTxOutIndexWithOffsetByHandle
              (void *handle,void *tx_data_handle,uint32_t offset,char *address,
              char *direct_locking_script,uint32_t *index)

{
  pointer pcVar1;
  ConfidentialTransactionContext *this;
  uint *puVar2;
  bool bVar3;
  undefined8 *puVar4;
  CfdException *pCVar5;
  bool is_bitcoin;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  string addr_str;
  ElementsAddressFactory address_factory;
  Address addr;
  Address addr_1;
  bool local_541;
  void *local_540;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_538;
  string local_518;
  AddressFactory local_4f8;
  undefined1 local_4d0 [32];
  undefined8 local_4b0 [2];
  pointer local_4a0;
  pointer local_488;
  pointer local_470;
  TapBranch local_458;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_3e0;
  Script local_3c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_388 [2];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  pointer local_2f0;
  pointer local_2d8;
  pointer local_2c0;
  TapBranch local_2a8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_230;
  Script local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  Address local_1a8;
  
  local_540 = handle;
  cfd::Initialize();
  pcVar1 = local_4d0 + 0x10;
  local_4d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)local_4d0);
  if ((pointer)local_4d0._0_8_ != pcVar1) {
    operator_delete((void *)local_4d0._0_8_);
  }
  local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_541 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_541);
  this = *(ConfidentialTransactionContext **)((long)tx_data_handle + 0x18);
  if (this == (ConfidentialTransactionContext *)0x0) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_4d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4d0,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_4d0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_541 == true) {
    bVar3 = cfd::capi::IsEmptyString(direct_locking_script);
    if (bVar3) {
      bVar3 = cfd::capi::IsEmptyString(address);
      puVar2 = local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar3) goto joined_r0x00437936;
      std::__cxx11::string::string((string *)local_320,address,(allocator *)&local_1a8);
      cfd::core::Address::Address((Address *)local_4d0,(string *)local_320);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_);
      }
      cfd::TransactionContext::IsFindTxOut
                ((TransactionContext *)this,(Address *)local_4d0,index,&local_538);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_388);
      cfd::core::Script::~Script(&local_3c8);
      local_458._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_3e0);
      cfd::core::TapBranch::~TapBranch(&local_458);
      if (local_470 != (pointer)0x0) {
        operator_delete(local_470);
      }
      if (local_488 != (pointer)0x0) {
        operator_delete(local_488);
      }
      if (local_4a0 != (pointer)0x0) {
        operator_delete(local_4a0);
      }
      puVar4 = local_4b0;
    }
    else {
      std::__cxx11::string::string
                ((string *)local_320,direct_locking_script,(allocator *)&local_1a8);
      cfd::core::Script::Script((Script *)local_4d0,(string *)local_320);
      cfd::TransactionContext::IsFindTxOut
                ((TransactionContext *)this,(Script *)local_4d0,index,&local_538);
LAB_0043766a:
      cfd::core::Script::~Script((Script *)local_4d0);
      puVar4 = (undefined8 *)(local_320 + 0x10);
    }
    puVar2 = local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((undefined8 *)puVar4[-2] != puVar4) {
      operator_delete((undefined8 *)puVar4[-2]);
      puVar2 = local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  else {
    bVar3 = cfd::capi::IsEmptyString(direct_locking_script);
    if (!bVar3) {
      std::__cxx11::string::string
                ((string *)local_320,direct_locking_script,(allocator *)&local_1a8);
      cfd::core::Script::Script((Script *)local_4d0,(string *)local_320);
      cfd::ConfidentialTransactionContext::IsFindTxOut(this,(Script *)local_4d0,index,&local_538);
      goto LAB_0043766a;
    }
    bVar3 = cfd::capi::IsEmptyString(address);
    if (bVar3) {
      local_4d0._0_8_ = local_4d0._0_8_ & 0xffffffff00000000;
      bVar3 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut(this,(uint32_t *)local_4d0);
      puVar2 = local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((bVar3) && (offset <= (uint)local_4d0._0_4_)) {
        if (index != (uint32_t *)0x0) {
          *index = local_4d0._0_4_;
        }
        goto LAB_004379f6;
      }
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_4f8);
      std::__cxx11::string::string((string *)&local_518,address,(allocator *)local_4d0);
      cfd::core::Address::Address((Address *)local_320);
      bVar3 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_518);
      if (bVar3) {
        cfd::ElementsAddressFactory::GetConfidentialAddress
                  ((ElementsConfidentialAddress *)local_4d0,(ElementsAddressFactory *)&local_4f8,
                   &local_518);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
                  (&local_1a8,(ElementsConfidentialAddress *)local_4d0);
        cfd::core::Address::operator=((Address *)local_320,&local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_1a8.format_data_);
        cfd::core::Script::~Script(&local_1a8.redeem_script_);
        local_1a8.script_tree_.super_TapBranch._vptr_TapBranch =
             (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_1a8.script_tree_.nodes_);
        cfd::core::TapBranch::~TapBranch(&local_1a8.script_tree_.super_TapBranch);
        if (local_1a8.schnorr_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.schnorr_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1a8.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.hash_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.address_._M_dataplus._M_p != &local_1a8.address_.field_2) {
          operator_delete(local_1a8.address_._M_dataplus._M_p);
        }
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_4d0);
      }
      else {
        cfd::AddressFactory::GetAddress((Address *)local_4d0,&local_4f8,&local_518);
        cfd::core::Address::operator=((Address *)local_320,(Address *)local_4d0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_388);
        cfd::core::Script::~Script(&local_3c8);
        local_458._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_3e0);
        cfd::core::TapBranch::~TapBranch(&local_458);
        if (local_470 != (pointer)0x0) {
          operator_delete(local_470);
        }
        if (local_488 != (pointer)0x0) {
          operator_delete(local_488);
        }
        if (local_4a0 != (pointer)0x0) {
          operator_delete(local_4a0);
        }
        if ((undefined8 *)local_4d0._16_8_ != local_4b0) {
          operator_delete((void *)local_4d0._16_8_);
        }
      }
      cfd::ConfidentialTransactionContext::IsFindTxOut(this,(Address *)local_320,index,&local_538);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d8);
      cfd::core::Script::~Script(&local_218);
      local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_230);
      cfd::core::TapBranch::~TapBranch(&local_2a8);
      if (local_2c0 != (pointer)0x0) {
        operator_delete(local_2c0);
      }
      if (local_2d8 != (pointer)0x0) {
        operator_delete(local_2d8);
      }
      if (local_2f0 != (pointer)0x0) {
        operator_delete(local_2f0);
      }
      if ((undefined1 *)local_320._16_8_ != local_300) {
        operator_delete((void *)local_320._16_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p);
      }
      local_4f8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_4f8.prefix_list_);
      puVar2 = local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
joined_r0x00437936:
  while( true ) {
    if (puVar2 == local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      if (index != (uint32_t *)0x0) {
        *index = 0;
      }
      if (offset != 0) {
        local_4d0._0_8_ = "cfdcapi_transaction.cpp";
        local_4d0._8_4_ = 0x1021;
        local_4d0._16_8_ = "CfdGetTxOutIndexWithOffsetByHandle";
        cfd::core::logger::log<>
                  ((CfdSourceLocation *)local_4d0,kCfdLogLevelWarning,"target not found by offset.")
        ;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_4d0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4d0,"There are no targets after the offset.","");
        cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_4d0);
        __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      local_4d0._0_8_ = "cfdcapi_transaction.cpp";
      local_4d0._8_4_ = 0x101c;
      local_4d0._16_8_ = "CfdGetTxOutIndexWithOffsetByHandle";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_4d0,kCfdLogLevelWarning,"target not found.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_4d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4d0,"Failed to parameter. search target is not found.","");
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_4d0);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (offset <= *puVar2) break;
    puVar2 = puVar2 + 1;
  }
  if (index != (uint32_t *)0x0) {
    *index = *puVar2;
  }
LAB_004379f6:
  if (local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_538.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdGetTxOutIndexWithOffsetByHandle(
    void* handle, void* tx_data_handle, uint32_t offset, const char* address,
    const char* direct_locking_script, uint32_t* index) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    std::vector<uint32_t> indexes;
    bool is_find = false;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(direct_locking_script)) {
        tx->IsFindTxOut(Script(direct_locking_script), index, &indexes);
      } else if (!IsEmptyString(address)) {
        Address addr(address);
        tx->IsFindTxOut(addr, index, &indexes);
      } else {
        // do nothing
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(direct_locking_script)) {
        tx->IsFindTxOut(Script(direct_locking_script), index, &indexes);
      } else if (!IsEmptyString(address)) {
        ElementsAddressFactory address_factory;
        std::string addr_str(address);
        Address addr;
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr_str)) {
          addr = address_factory.GetConfidentialAddress(addr_str)
                     .GetUnblindedAddress();
        } else {
          addr = address_factory.GetAddress(addr_str);
        }
        tx->IsFindTxOut(addr, index, &indexes);
      } else {
        // fee
        uint32_t temp_index = 0;
        is_find = tx->IsFindFeeTxOut(&temp_index);
        if (is_find) {
          if (offset > temp_index)
            is_find = false;
          else if (index != nullptr)
            *index = temp_index;
        }
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if ((!is_find) && (!indexes.empty())) {
      for (const auto& work_index : indexes) {
        if (offset <= work_index) {
          is_find = true;
          if (index != nullptr) *index = work_index;
          break;
        }
      }
    }

    if (!is_find) {
      if (index != nullptr) *index = 0;
      if (offset == 0) {
        warn(CFD_LOG_SOURCE, "target not found.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. search target is not found.");
      } else {
        warn(CFD_LOG_SOURCE, "target not found by offset.");
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "There are no targets after the offset.");
      }
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}